

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif_parse.cc
# Opt level: O0

void yy_reduce_print(yy_state_t *yyssp,YYSTYPE *yyvsp,int yyrule)

{
  char cVar1;
  int in_EDX;
  YYSTYPE *in_RSI;
  undefined8 in_RDI;
  FILE *unaff_retaddr;
  int yyi;
  int yynrhs;
  int yylno;
  int local_20;
  
  cVar1 = ""[in_EDX];
  fprintf(_stderr,"Reducing stack by rule %d (line %d):\n",(ulong)(in_EDX - 1),
          (ulong)(uint)(int)yyrline[in_EDX]);
  for (local_20 = 0; local_20 < cVar1; local_20 = local_20 + 1) {
    fprintf(_stderr,"   $%d = ",(ulong)(local_20 + 1));
    yy_symbol_print(unaff_retaddr,(yysymbol_kind_t)((ulong)in_RDI >> 0x20),in_RSI);
    fprintf(_stderr,"\n");
  }
  return;
}

Assistant:

static void
yy_reduce_print (yy_state_t *yyssp, YYSTYPE *yyvsp,
                 int yyrule)
{
  int yylno = yyrline[yyrule];
  int yynrhs = yyr2[yyrule];
  int yyi;
  YYFPRINTF (stderr, "Reducing stack by rule %d (line %d):\n",
             yyrule - 1, yylno);
  /* The symbols being reduced.  */
  for (yyi = 0; yyi < yynrhs; yyi++)
    {
      YYFPRINTF (stderr, "   $%d = ", yyi + 1);
      yy_symbol_print (stderr,
                       YY_ACCESSING_SYMBOL (+yyssp[yyi + 1 - yynrhs]),
                       &yyvsp[(yyi + 1) - (yynrhs)]);
      YYFPRINTF (stderr, "\n");
    }
}